

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

void DisplayFunction54(Idx<Variable> variable,lua_State *L,int index,lua_Debug_54 *ar)

{
  byte bVar1;
  pointer pVVar2;
  pointer pVVar3;
  string *psVar4;
  lua_Debug_54 *plVar5;
  uint uVar6;
  int iVar7;
  Variable *pVVar8;
  char *pcVar9;
  undefined8 *puVar10;
  uint uVar11;
  size_type *psVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  Arena<Variable> *this;
  uint uVar16;
  int paramIndex;
  uint uVar17;
  uint __len;
  bool bVar18;
  Idx<Variable> id;
  Idx<Variable> id_00;
  Idx<Variable> id_01;
  Idx<Variable> id_02;
  Idx<Variable> id_03;
  Idx<Variable> id_04;
  Idx<Variable> id_05;
  Idx<Variable> id_06;
  Idx<Variable> id_07;
  Idx<Variable> id_08;
  Idx<Variable> id_09;
  Idx<Variable> id_10;
  Idx<Variable> id_11;
  string showValue;
  string sourceText;
  string what;
  string local_b8;
  string local_98;
  lua_Debug_54 *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this = variable._arena;
  uVar16 = variable.Raw;
  if (ar->what == (char *)0x0) {
    return;
  }
  std::__cxx11::string::string((string *)local_50,ar->what,(allocator *)&local_b8);
  iVar7 = std::__cxx11::string::compare((char *)local_50);
  if (iVar7 == 0) {
    bVar1 = ar->nparams;
    bVar14 = 10;
    if (bVar1 < 10) {
      bVar14 = bVar1;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_78 = ar;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"function(","");
    (*lua_pushvalue)(L,index);
    if (bVar1 != 0) {
      uVar17 = 1;
      do {
        pcVar9 = (*lua_getlocal)(L,(lua_Debug *)0x0,uVar17);
        if ((pcVar9 != (char *)0x0) &&
           (std::__cxx11::string::append((char *)&local_b8), uVar17 != bVar14)) {
          std::__cxx11::string::append((char *)&local_b8);
        }
        bVar18 = uVar17 != bVar14;
        uVar17 = uVar17 + 1;
      } while (bVar18);
    }
    std::__cxx11::string::push_back((char)&local_b8);
    id_00._4_4_ = 0;
    id_00.Raw = uVar16;
    id_00._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_00);
    std::__cxx11::string::_M_assign((string *)&pVVar8->value);
    id_01._4_4_ = 0;
    id_01.Raw = uVar16;
    id_01._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_01);
    pVVar8->valueType = 9;
    id_02._4_4_ = 0;
    id_02.Raw = uVar16;
    id_02._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_02);
    std::__cxx11::string::_M_replace
              ((ulong)&pVVar8->valueTypeName,0,(char *)(pVVar8->valueTypeName)._M_string_length,
               0x168141);
    pVVar2 = (this->_data).super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar3 = (this->_data).super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&this->_data);
    uVar16 = (int)((ulong)((long)pVVar2 - (long)pVVar3) >> 3) * 0x286bca1b;
    id_03._4_4_ = 0;
    id_03.Raw = uVar16;
    id_03._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_03);
    pVVar8->nameType = 4;
    id_04._4_4_ = 0;
    id_04.Raw = uVar16;
    id_04._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_04);
    pVVar8->valueType = 6;
    id_05._4_4_ = 0;
    id_05.Raw = uVar16;
    id_05._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_05);
    std::__cxx11::string::_M_replace
              ((ulong)&pVVar8->name,0,(char *)(pVVar8->name)._M_string_length,0x16232b);
    ToPointer_abi_cxx11_(&local_98,L,index);
    plVar5 = local_78;
    id_06._4_4_ = 0;
    id_06.Raw = uVar16;
    id_06._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id_06);
    std::__cxx11::string::operator=((string *)&pVVar8->value,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (plVar5->source != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_98,plVar5->source,(allocator *)local_70);
      if ((local_98._M_string_length != 0) && (*local_98._M_dataplus._M_p == '@')) {
        std::__cxx11::string::substr((ulong)local_70,(ulong)&local_98);
        std::__cxx11::string::operator=((string *)&local_98,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
      }
      pVVar2 = (this->_data).super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar3 = (this->_data).super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&this->_data);
      uVar15 = (int)((ulong)((long)pVVar2 - (long)pVVar3) >> 3) * 0x286bca1b;
      id_07._4_4_ = 0;
      id_07.Raw = uVar15;
      id_07._arena = this;
      pVVar8 = Arena<Variable>::Index(this,id_07);
      pVVar8->nameType = 4;
      id_08._4_4_ = 0;
      id_08.Raw = uVar15;
      id_08._arena = this;
      pVVar8 = Arena<Variable>::Index(this,id_08);
      pVVar8->valueType = 4;
      id_09._4_4_ = 0;
      id_09.Raw = uVar15;
      id_09._arena = this;
      pVVar8 = Arena<Variable>::Index(this,id_09);
      std::__cxx11::string::_M_replace
                ((ulong)&pVVar8->name,0,(char *)(pVVar8->name)._M_string_length,0x16814a);
      pcVar9 = (char *)std::__cxx11::string::append((char *)&local_98);
      uVar16 = local_78->linedefined;
      uVar17 = -uVar16;
      if (0 < (int)uVar16) {
        uVar17 = uVar16;
      }
      __len = 1;
      if (9 < uVar17) {
        uVar13 = (ulong)uVar17;
        uVar6 = 4;
        do {
          __len = uVar6;
          uVar11 = (uint)uVar13;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_001467ad;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_001467ad;
          }
          if (uVar11 < 10000) goto LAB_001467ad;
          uVar13 = uVar13 / 10000;
          uVar6 = __len + 4;
        } while (99999 < uVar11);
        __len = __len + 1;
      }
LAB_001467ad:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)((int)uVar16 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (uVar16 >> 0x1f),__len,uVar17);
      std::__cxx11::string::_M_append(pcVar9,(ulong)local_70[0]);
      id_11._4_4_ = 0;
      id_11.Raw = uVar15;
      id_11._arena = this;
      pVVar8 = Arena<Variable>::Index(this,id_11);
      std::__cxx11::string::_M_assign((string *)&pVVar8->value);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)local_50);
    if (iVar7 == 0) {
      ToPointer_abi_cxx11_(&local_98,L,index);
      puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x168151)
      ;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b8.field_2._M_allocated_capacity = *psVar12;
        local_b8.field_2._8_8_ = puVar10[3];
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar12;
        local_b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_b8._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      id_10._4_4_ = 0;
      id_10.Raw = uVar16;
      id_10._arena = this;
      pVVar8 = Arena<Variable>::Index(this,id_10);
      std::__cxx11::string::operator=((string *)&pVVar8->value,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      psVar4 = &local_98;
      goto LAB_00146840;
    }
    ToPointer_abi_cxx11_(&local_b8,L,index);
    id._4_4_ = 0;
    id.Raw = uVar16;
    id._arena = this;
    pVVar8 = Arena<Variable>::Index(this,id);
    std::__cxx11::string::operator=((string *)&pVVar8->value,(string *)&local_b8);
  }
  psVar4 = &local_b8;
  local_98._M_dataplus._M_p = local_b8._M_dataplus._M_p;
LAB_00146840:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &psVar4->field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

void DisplayFunction54(Idx<Variable> variable, lua_State *L, int index, lua_Debug_54 &ar) {
	if (ar.what == nullptr) {
		return;
	}
	std::string what = ar.what;
	if (what == "Lua") {
		auto paramNum = ar.nparams > 10 ? 10 : ar.nparams;
		std::string showValue = "function(";
		lua_pushvalue(L, index);
		for (auto i = 0; i != paramNum; i++) {
			auto paramIndex = i + 1;
			auto paramName = lua_getlocal(L, nullptr, paramIndex);
			if (paramName) {
				showValue.append(paramName);
				if (paramIndex != paramNum) {
					showValue.append(", ");
				}
			}
		}
		showValue.push_back(')');
		variable->value = showValue;
		variable->valueType = 9;
		variable->valueTypeName = "function";
		// ptr
		auto ptr = variable.GetArena()->Alloc();
		ptr->nameType = LUA_TSTRING;
		ptr->valueType = LUA_TFUNCTION;
		ptr->name = "pointer";
		ptr->value = ToPointer(L, index);

		// source
		if (ar.source) {
			std::string sourceText = ar.source;
			if (!sourceText.empty() && sourceText.front() == '@') {
				sourceText = sourceText.substr(1);
			}
			auto source = variable.GetArena()->Alloc();
			source->nameType = LUA_TSTRING;
			source->valueType = LUA_TSTRING;
			source->name = "source";
			source->value = sourceText.append(":").append(std::to_string(ar.linedefined));
		}
	} else if (what == "C") {
		variable->value = "C " + ToPointer(L, index);
	} else {
		variable->value = ToPointer(L, index);
		return;
	}
}